

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O3

int av1_hash_is_horizontal_perfect
              (YV12_BUFFER_CONFIG *picture,int block_size,int x_start,int y_start)

{
  uint8_t *puVar1;
  short *psVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = (long)(picture->field_4).field_0.y_stride;
  puVar1 = (picture->field_5).buffers[0] + (long)x_start + y_start * lVar4;
  if ((picture->flags & 8) == 0) {
    if (0 < block_size) {
      iVar3 = 0;
      do {
        if (block_size != 1) {
          uVar5 = 1;
          do {
            if (puVar1[uVar5] != *puVar1) {
              return 0;
            }
            uVar5 = uVar5 + 1;
          } while ((uint)block_size != uVar5);
        }
        puVar1 = puVar1 + lVar4;
        iVar3 = iVar3 + 1;
      } while (iVar3 != block_size);
    }
  }
  else if (0 < block_size) {
    psVar2 = (short *)((long)puVar1 * 2);
    iVar3 = 0;
    do {
      if (block_size != 1) {
        uVar5 = 1;
        do {
          if (psVar2[uVar5] != *psVar2) {
            return 0;
          }
          uVar5 = uVar5 + 1;
        } while ((uint)block_size != uVar5);
      }
      psVar2 = psVar2 + lVar4;
      iVar3 = iVar3 + 1;
    } while (iVar3 != block_size);
  }
  return 1;
}

Assistant:

int av1_hash_is_horizontal_perfect(const YV12_BUFFER_CONFIG *picture,
                                   int block_size, int x_start, int y_start) {
  const int stride = picture->y_stride;
  const uint8_t *p = picture->y_buffer + y_start * stride + x_start;

  if (picture->flags & YV12_FLAG_HIGHBITDEPTH) {
    const uint16_t *p16 = CONVERT_TO_SHORTPTR(p);
    for (int i = 0; i < block_size; i++) {
      for (int j = 1; j < block_size; j++) {
        if (p16[j] != p16[0]) {
          return 0;
        }
      }
      p16 += stride;
    }
  } else {
    for (int i = 0; i < block_size; i++) {
      for (int j = 1; j < block_size; j++) {
        if (p[j] != p[0]) {
          return 0;
        }
      }
      p += stride;
    }
  }

  return 1;
}